

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  ulong uVar1;
  SooRep local_10;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == was_soo) {
    if (elements != (void *)0x0) {
      if (((ulong)elements & 7) == 0) {
        if (was_soo) {
          (this->field_0).long_rep.size = (uint)uVar1 & 3;
        }
        (this->field_0).long_rep.capacity = capacity;
        (this->field_0).long_rep.elements_int = (ulong)elements | 4;
        return;
      }
      goto LAB_0018e8ea;
    }
  }
  else {
    set_non_soo();
  }
  set_non_soo(&local_10);
LAB_0018e8ea:
  set_non_soo();
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }